

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdrInv.c
# Opt level: O3

int Pdr_InvUsedFlopNum(Vec_Int_t *vInv)

{
  int *__ptr;
  Vec_Int_t *__ptr_00;
  long lVar1;
  int iVar2;
  
  __ptr_00 = Pdr_InvCounts(vInv);
  __ptr = __ptr_00->pArray;
  if ((long)__ptr_00->nSize < 1) {
    iVar2 = 0;
    if (__ptr == (int *)0x0) goto LAB_005f7898;
  }
  else {
    lVar1 = 0;
    iVar2 = 0;
    do {
      iVar2 = iVar2 + (uint)(__ptr[lVar1] == 0);
      lVar1 = lVar1 + 1;
    } while (__ptr_00->nSize != lVar1);
  }
  free(__ptr);
LAB_005f7898:
  free(__ptr_00);
  if ((long)vInv->nSize < 1) {
    __assert_fail("p->nSize > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                  ,0x203,"int Vec_IntEntryLast(Vec_Int_t *)");
  }
  return vInv->pArray[(long)vInv->nSize + -1] - iVar2;
}

Assistant:

int Pdr_InvUsedFlopNum( Vec_Int_t * vInv )
{
    Vec_Int_t * vCounts = Pdr_InvCounts( vInv );
    int nZeros = Vec_IntCountZero( vCounts );
    Vec_IntFree( vCounts );
    return Vec_IntEntryLast(vInv) - nZeros;
}